

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O2

_Bool COSE_Sign_Sign(HCOSE_SIGN h,cose_errback *perr)

{
  COSE_SignerInfo *pSigner;
  cose_error cVar1;
  _Bool _Var2;
  cn_cbor *pcborBody;
  cn_cbor *pcborProtected;
  HCOSE_SIGN p_Var3;
  bool bVar4;
  
  _Var2 = IsValidSignHandle(h);
  if (_Var2) {
    pcborBody = _COSE_arrayget_int((COSE *)h,2);
    if ((pcborBody != (cn_cbor *)0x0) && (pcborBody->type == CN_CBOR_BYTES)) {
      pcborProtected = _COSE_encode_protected((COSE *)h,perr);
      if (pcborProtected == (cn_cbor *)0x0) {
        return false;
      }
      p_Var3 = h + 0x58;
      do {
        pSigner = *(COSE_SignerInfo **)p_Var3;
        bVar4 = pSigner == (COSE_SignerInfo *)0x0;
        if (bVar4) {
          return bVar4;
        }
        _Var2 = _COSE_Signer_sign(pSigner,pcborBody,pcborProtected,perr);
        p_Var3 = (HCOSE_SIGN)&pSigner->m_signerNext;
      } while (_Var2);
      return bVar4;
    }
    if (perr == (cose_errback *)0x0) {
      return false;
    }
    cVar1 = COSE_ERR_INVALID_PARAMETER;
  }
  else {
    if (perr == (cose_errback *)0x0) {
      return false;
    }
    cVar1 = COSE_ERR_INVALID_HANDLE;
  }
  perr->err = cVar1;
  return false;
}

Assistant:

bool COSE_Sign_Sign(HCOSE_SIGN h, cose_errback * perr)
{
#ifdef USE_CBOR_CONTEXT
  // cn_cbor_context * context = NULL;
#endif
	COSE_SignMessage * pMessage = (COSE_SignMessage *)h;
	COSE_SignerInfo * pSigner;
	const cn_cbor * pcborBody;
	const cn_cbor * pcborProtected;

	if (!IsValidSignHandle(h)) {
		CHECK_CONDITION(false, COSE_ERR_INVALID_HANDLE);
	errorReturn:
		return false;
	}
#ifdef USE_CBOR_CONTEXT
	//	context = &pMessage->m_message.m_allocContext;
#endif

	pcborBody = _COSE_arrayget_int(&pMessage->m_message, INDEX_BODY);
	CHECK_CONDITION((pcborBody != NULL) && (pcborBody->type == CN_CBOR_BYTES), COSE_ERR_INVALID_PARAMETER);

	pcborProtected = _COSE_encode_protected(&pMessage->m_message, perr);
	if (pcborProtected == NULL) goto errorReturn;

	for (pSigner = pMessage->m_signerFirst; pSigner != NULL; pSigner = pSigner->m_signerNext) {
		if (!_COSE_Signer_sign(pSigner, pcborBody, pcborProtected, perr)) goto errorReturn;
	}

	return true;
}